

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  long lVar1;
  _xmlNode *p_Var2;
  xmlDtdPtr dtd;
  uint uVar3;
  int iVar4;
  uint uVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  xmlAttributePtr pxVar8;
  xmlNsPtr ns;
  xmlChar *pxVar9;
  xmlParserCtxtPtr ctxt;
  xmlNodePtr pxVar10;
  xmlAttributePtr pxVar11;
  xmlChar **ppxVar12;
  bool bVar13;
  xmlChar *prefix;
  xmlChar *local_a8;
  uint local_9c;
  xmlElementPtr local_98;
  xmlChar *local_90;
  xmlChar **local_88;
  xmlChar *local_80;
  xmlNodePtr local_78;
  xmlNodePtr local_70;
  xmlChar local_68 [56];
  
  if (fullname != (xmlChar *)0x0 && ctx != (void *)0x0) {
    lVar1 = *(long *)((long)ctx + 0x10);
    if (lVar1 != 0) {
      pxVar10 = *(xmlNodePtr *)((long)ctx + 0x50);
      if (((*(int *)((long)ctx + 0x9c) != 0) && (*(long *)(lVar1 + 0x58) == 0)) &&
         ((lVar1 = *(long *)(lVar1 + 0x50), lVar1 == 0 ||
          ((((*(long *)(lVar1 + 0x48) == 0 && (*(long *)(lVar1 + 0x50) == 0)) &&
            (*(long *)(lVar1 + 0x58) == 0)) && (*(long *)(lVar1 + 0x60) == 0)))))) {
        xmlErrValid((xmlParserCtxtPtr)ctx,XML_ERR_NO_DTD,"Validation failed: no DTD found !",
                    (char *)0x0,(char *)0x0);
        *(undefined4 *)((long)ctx + 0x9c) = 0;
      }
      pxVar6 = xmlSplitQName((xmlParserCtxtPtr)ctx,fullname,&local_a8);
      pxVar7 = xmlNewDocNodeEatName
                         (*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,pxVar6,(xmlChar *)0x0);
      if (pxVar7 == (xmlNodePtr)0x0) {
        if (local_a8 != (xmlChar *)0x0) {
          (*xmlFree)(local_a8);
        }
        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
      }
      else {
        p_Var2 = (*(xmlNodePtr *)((long)ctx + 0x10))->children;
        if (p_Var2 == (_xmlNode *)0x0) {
          xmlAddChild(*(xmlNodePtr *)((long)ctx + 0x10),pxVar7);
        }
        else if (pxVar10 == (xmlNodePtr)0x0) {
          pxVar10 = p_Var2;
        }
        *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
        if ((*(int *)((long)ctx + 0x1b4) != 0) && (*(long *)((long)ctx + 0x38) != 0)) {
          uVar5 = *(uint *)(*(long *)((long)ctx + 0x38) + 0x34);
          uVar3 = 0xffff;
          if (uVar5 < 0xffff) {
            uVar3 = uVar5;
          }
          pxVar7->line = (unsigned_short)uVar3;
        }
        iVar4 = nodePush((xmlParserCtxtPtr)ctx,pxVar7);
        if (iVar4 < 0) {
          xmlUnlinkNode(pxVar7);
          xmlFreeNode(pxVar7);
        }
        else {
          local_90 = pxVar6;
          if (pxVar10 != (xmlNodePtr)0x0) {
            if (pxVar10->type == XML_ELEMENT_NODE) {
              xmlAddChild(pxVar10,pxVar7);
            }
            else {
              xmlAddSibling(pxVar10,pxVar7);
            }
          }
          pxVar9 = local_90;
          pxVar6 = local_a8;
          if (*(int *)((long)ctx + 0x34) == 0) {
            dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50);
            local_78 = pxVar10;
            local_70 = pxVar7;
            if ((dtd != (xmlDtdPtr)0x0) || (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) {
              local_98 = xmlGetDtdQElementDesc(dtd,local_90,local_a8);
              bVar13 = local_98 == (xmlElementPtr)0x0;
              local_80 = pxVar6;
              if (bVar13) {
                local_98 = xmlGetDtdQElementDesc
                                     (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar9,
                                      pxVar6);
              }
              local_9c = (uint)!bVar13;
              local_88 = atts + 2;
              do {
                if (local_98 == (xmlElementPtr)0x0) break;
                if (((*(int *)(*(long *)((long)ctx + 0x10) + 0x4c) == 1) &&
                    (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) &&
                   (*(int *)((long)ctx + 0x9c) != 0)) {
                  for (pxVar11 = local_98->attributes; pxVar11 != (xmlAttributePtr)0x0;
                      pxVar11 = pxVar11->nexth) {
                    if (((pxVar11->defaultValue != (xmlChar *)0x0) &&
                        (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)
                                                      (*(long *)((long)ctx + 0x10) + 0x58),
                                                     pxVar11->elem,pxVar11->name,pxVar11->prefix),
                        pxVar8 == pxVar11)) &&
                       (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)
                                                     (*(long *)((long)ctx + 0x10) + 0x50),
                                                    pxVar11->elem,pxVar11->name,pxVar11->prefix),
                       pxVar8 == (xmlAttributePtr)0x0)) {
                      if (pxVar11->prefix == (xmlChar *)0x0) {
                        pxVar6 = xmlStrdup(pxVar11->name);
                      }
                      else {
                        pxVar6 = xmlStrdup(pxVar11->prefix);
                        pxVar6 = xmlStrcat(pxVar6,":");
                        pxVar6 = xmlStrcat(pxVar6,pxVar11->name);
                      }
                      if (pxVar6 == (xmlChar *)0x0) {
                        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
                      }
                      else {
                        if (atts != (xmlChar **)0x0) {
                          pxVar9 = *atts;
                          ppxVar12 = local_88;
                          while (pxVar9 != (xmlChar *)0x0) {
                            iVar4 = xmlStrEqual(pxVar9,pxVar6);
                            if (iVar4 != 0) goto LAB_0017c228;
                            pxVar9 = *ppxVar12;
                            ppxVar12 = ppxVar12 + 2;
                          }
                        }
                        xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_STANDALONE_DEFAULTED,
                                    "standalone: attribute %s on %s defaulted from external subset\n"
                                    ,(char *)pxVar6,(char *)pxVar11->elem);
LAB_0017c228:
                        (*xmlFree)(pxVar6);
                      }
                      if (pxVar6 == (xmlChar *)0x0) break;
                    }
                  }
                }
                for (pxVar11 = local_98->attributes; pxVar11 != (xmlAttributePtr)0x0;
                    pxVar11 = pxVar11->nexth) {
                  if (((pxVar11->defaultValue != (xmlChar *)0x0) &&
                      ((((pxVar11->prefix != (xmlChar *)0x0 &&
                         (iVar4 = xmlStrEqual(pxVar11->prefix,"xmlns"), iVar4 != 0)) ||
                        ((pxVar11->prefix == (xmlChar *)0x0 &&
                         (iVar4 = xmlStrEqual(pxVar11->name,"xmlns"), iVar4 != 0)))) ||
                       ((*(byte *)((long)ctx + 0x1b0) & 4) != 0)))) &&
                     (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50)
                                                  ,pxVar11->elem,pxVar11->name,pxVar11->prefix),
                     pxVar8 == pxVar11 || pxVar8 == (xmlAttributePtr)0x0)) {
                    pxVar6 = xmlBuildQName(pxVar11->name,pxVar11->prefix,local_68,0x32);
                    if (pxVar6 == (xmlChar *)0x0) {
                      xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
                    }
                    else {
                      if (atts != (xmlChar **)0x0) {
                        pxVar9 = *atts;
                        ppxVar12 = local_88;
                        while (pxVar9 != (xmlChar *)0x0) {
                          iVar4 = xmlStrEqual(pxVar9,pxVar6);
                          if (iVar4 != 0) goto LAB_0017c342;
                          pxVar9 = *ppxVar12;
                          ppxVar12 = ppxVar12 + 2;
                        }
                      }
                      xmlSAX2AttributeInternal(ctx,pxVar6,pxVar11->defaultValue,local_80);
LAB_0017c342:
                      if ((pxVar6 != local_68) && (pxVar6 != pxVar11->name)) {
                        (*xmlFree)(pxVar6);
                      }
                    }
                    if (pxVar6 == (xmlChar *)0x0) {
                      bVar13 = false;
                      goto LAB_0017c3ae;
                    }
                  }
                }
                bVar13 = local_9c == 1;
                if (bVar13) {
                  local_98 = xmlGetDtdQElementDesc
                                       (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),local_90,
                                        local_80);
                }
                local_9c = 0;
LAB_0017c3ae:
              } while (bVar13);
            }
            pxVar7 = local_70;
            pxVar10 = local_78;
            if (atts != (xmlChar **)0x0) {
              pxVar6 = *atts;
              pxVar9 = atts[1];
              if (pxVar9 != (xmlChar *)0x0 && pxVar6 != (xmlChar *)0x0) {
                ppxVar12 = atts + 3;
                do {
                  if ((((*pxVar6 == 'x') && (pxVar6[1] == 'm')) && (pxVar6[2] == 'l')) &&
                     ((pxVar6[3] == 'n' && (pxVar6[4] == 's')))) {
                    xmlSAX2AttributeInternal(ctx,pxVar6,pxVar9,local_a8);
                  }
                  pxVar6 = ppxVar12[-1];
                  if (pxVar6 == (xmlChar *)0x0) break;
                  pxVar9 = *ppxVar12;
                  ppxVar12 = ppxVar12 + 2;
                } while (pxVar9 != (xmlChar *)0x0);
              }
            }
            ns = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),pxVar7,local_a8);
            if ((pxVar10 != (xmlNodePtr)0x0) && (ns == (xmlNsPtr)0x0)) {
              ns = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),pxVar10,local_a8);
            }
            if ((local_a8 != (xmlChar *)0x0) && (ns == (xmlNsPtr)0x0)) {
              ns = xmlNewNs(pxVar7,(xmlChar *)0x0,local_a8);
              xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                           "Namespace prefix %s is not defined\n",local_a8,(xmlChar *)0x0);
            }
            if (((ns != (xmlNsPtr)0x0) && (ns->href != (xmlChar *)0x0)) &&
               ((*ns->href != '\0' || (ns->prefix != (xmlChar *)0x0)))) {
              xmlSetNs(pxVar7,ns);
            }
          }
          if (atts != (xmlChar **)0x0) {
            pxVar6 = *atts;
            pxVar9 = atts[1];
            if (*(int *)((long)ctx + 0x34) == 0) {
              if (pxVar9 != (xmlChar *)0x0 && pxVar6 != (xmlChar *)0x0) {
                ppxVar12 = atts + 3;
                do {
                  if ((((*pxVar6 != 'x') || (pxVar6[1] != 'm')) || (pxVar6[2] != 'l')) ||
                     ((pxVar6[3] != 'n' || (pxVar6[4] != 's')))) {
                    xmlSAX2AttributeInternal(ctx,pxVar6,pxVar9,(xmlChar *)0x0);
                  }
                  pxVar6 = ppxVar12[-1];
                  if (pxVar6 == (xmlChar *)0x0) break;
                  pxVar9 = *ppxVar12;
                  ppxVar12 = ppxVar12 + 2;
                } while (pxVar9 != (xmlChar *)0x0);
              }
            }
            else if (pxVar6 != (xmlChar *)0x0) {
              ppxVar12 = atts + 3;
              do {
                xmlSAX2AttributeInternal(ctx,pxVar6,pxVar9,(xmlChar *)0x0);
                pxVar6 = ppxVar12[-1];
                pxVar9 = *ppxVar12;
                ppxVar12 = ppxVar12 + 2;
              } while (pxVar6 != (xmlChar *)0x0);
            }
          }
          if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(byte *)((long)ctx + 0xd0) & 1) == 0)) {
            iVar4 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                        *(xmlDocPtr *)((long)ctx + 0x10));
            if (iVar4 < 1) {
              *(undefined4 *)((long)ctx + 0x98) = 0;
            }
            if (iVar4 < 0) {
              *(undefined4 *)((long)ctx + 0x18) = 0;
            }
            uVar5 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                    *(xmlDocPtr *)((long)ctx + 0x10));
            *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar5;
            *(byte *)((long)ctx + 0xd0) = *(byte *)((long)ctx + 0xd0) | 1;
          }
        }
        if (local_a8 != (xmlChar *)0x0) {
          (*xmlFree)(local_a8);
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;
    xmlNodePtr parent;
    xmlNsPtr ns;
    xmlChar *name;
    xmlChar *prefix;
    const xmlChar *att;
    const xmlChar *value;
    int i;

    if ((ctx == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL)) return;
    parent = ctxt->node;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2StartElement(%s)\n", fullname);
#endif

    /*
     * First check on validity:
     */
    if (ctxt->validate && (ctxt->myDoc->extSubset == NULL) &&
        ((ctxt->myDoc->intSubset == NULL) ||
	 ((ctxt->myDoc->intSubset->notations == NULL) &&
	  (ctxt->myDoc->intSubset->elements == NULL) &&
	  (ctxt->myDoc->intSubset->attributes == NULL) &&
	  (ctxt->myDoc->intSubset->entities == NULL)))) {
	xmlErrValid(ctxt, XML_ERR_NO_DTD,
	  "Validation failed: no DTD found !", NULL, NULL);
	ctxt->validate = 0;
    }


    /*
     * Split the full name into a namespace prefix and the tag name
     */
    name = xmlSplitQName(ctxt, fullname, &prefix);


    /*
     * Note : the namespace resolution is deferred until the end of the
     *        attributes parsing, since local namespace can be defined as
     *        an attribute at this level.
     */
    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL, name, NULL);
    if (ret == NULL) {
        if (prefix != NULL)
	    xmlFree(prefix);
	xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
        return;
    }
    if (ctxt->myDoc->children == NULL) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext, "Setting %s as root\n", name);
#endif
        xmlAddChild((xmlNodePtr) ctxt->myDoc, (xmlNodePtr) ret);
    } else if (parent == NULL) {
        parent = ctxt->myDoc->children;
    }
    ctxt->nodemem = -1;
    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
		ret->line = ctxt->input->line;
	    else
	        ret->line = USHRT_MAX;
	}
    }

    /*
     * We are parsing a new node.
     */
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext, "pushing(%s)\n", name);
#endif
    if (nodePush(ctxt, ret) < 0) {
        xmlUnlinkNode(ret);
        xmlFreeNode(ret);
        if (prefix != NULL)
            xmlFree(prefix);
        return;
    }

    /*
     * Link the child element
     */
    if (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE) {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "adding child %s to %s\n", name, parent->name);
#endif
	    xmlAddChild(parent, ret);
	} else {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "adding sibling %s to ", name);
	    xmlDebugDumpOneNode(stderr, parent, 0);
#endif
	    xmlAddSibling(parent, ret);
	}
    }

    if (!ctxt->html) {
        /*
         * Insert all the defaulted attributes from the DTD especially
         * namespaces
         */
        if ((ctxt->myDoc->intSubset != NULL) ||
            (ctxt->myDoc->extSubset != NULL)) {
            xmlCheckDefaultedAttributes(ctxt, name, prefix, atts);
        }

        /*
         * process all the attributes whose name start with "xmlns"
         */
        if (atts != NULL) {
            i = 0;
            att = atts[i++];
            value = atts[i++];
	    while ((att != NULL) && (value != NULL)) {
		if ((att[0] == 'x') && (att[1] == 'm') && (att[2] == 'l') &&
		    (att[3] == 'n') && (att[4] == 's'))
		    xmlSAX2AttributeInternal(ctxt, att, value, prefix);

		att = atts[i++];
		value = atts[i++];
	    }
        }

        /*
         * Search the namespace, note that since the attributes have been
         * processed, the local namespaces are available.
         */
        ns = xmlSearchNs(ctxt->myDoc, ret, prefix);
        if ((ns == NULL) && (parent != NULL))
            ns = xmlSearchNs(ctxt->myDoc, parent, prefix);
        if ((prefix != NULL) && (ns == NULL)) {
            ns = xmlNewNs(ret, NULL, prefix);
            xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                         "Namespace prefix %s is not defined\n",
                         prefix, NULL);
        }

        /*
         * set the namespace node, making sure that if the default namespace
         * is unbound on a parent we simply keep it NULL
         */
        if ((ns != NULL) && (ns->href != NULL) &&
            ((ns->href[0] != 0) || (ns->prefix != NULL)))
            xmlSetNs(ret, ns);
    }

    /*
     * process all the other attributes
     */
    if (atts != NULL) {
        i = 0;
	att = atts[i++];
	value = atts[i++];
	if (ctxt->html) {
	    while (att != NULL) {
		xmlSAX2AttributeInternal(ctxt, att, value, NULL);
		att = atts[i++];
		value = atts[i++];
	    }
	} else {
	    while ((att != NULL) && (value != NULL)) {
		if ((att[0] != 'x') || (att[1] != 'm') || (att[2] != 'l') ||
		    (att[3] != 'n') || (att[4] != 's'))
		    xmlSAX2AttributeInternal(ctxt, att, value, NULL);

		/*
		 * Next ones
		 */
		att = atts[i++];
		value = atts[i++];
	    }
	}
    }

#ifdef LIBXML_VALID_ENABLED
    /*
     * If it's the Document root, finish the DTD validation and
     * check the document root element for validity
     */
    if ((ctxt->validate) &&
        ((ctxt->vctxt.flags & XML_VCTXT_DTD_VALIDATED) == 0)) {
	int chk;

	chk = xmlValidateDtdFinal(&ctxt->vctxt, ctxt->myDoc);
	if (chk <= 0)
	    ctxt->valid = 0;
	if (chk < 0)
	    ctxt->wellFormed = 0;
	ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
	ctxt->vctxt.flags |= XML_VCTXT_DTD_VALIDATED;
    }
#endif /* LIBXML_VALID_ENABLED */

    if (prefix != NULL)
	xmlFree(prefix);

}